

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::TreeEnsembleParameters::SerializeWithCachedSizes
          (TreeEnsembleParameters *this,CodedOutputStream *output)

{
  int iVar1;
  Rep *pRVar2;
  Type *value;
  int index;
  double *a;
  
  iVar1 = (this->nodes_).super_RepeatedPtrFieldBase.current_size_;
  for (index = 0; iVar1 != index; index = index + 1) {
    value = google::protobuf::internal::RepeatedPtrFieldBase::
            Get<google::protobuf::RepeatedPtrField<CoreML::Specification::TreeEnsembleParameters_TreeNode>::TypeHandler>
                      (&(this->nodes_).super_RepeatedPtrFieldBase,index);
    google::protobuf::internal::WireFormatLite::WriteMessage(1,&value->super_MessageLite,output);
  }
  if (this->numpredictiondimensions_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteUInt64(2,this->numpredictiondimensions_,output)
    ;
  }
  if (0 < (this->basepredictionvalue_).current_size_) {
    google::protobuf::io::CodedOutputStream::WriteVarint32(output,0x1a);
    google::protobuf::io::CodedOutputStream::WriteVarint32
              (output,this->_basepredictionvalue_cached_byte_size_);
    pRVar2 = (this->basepredictionvalue_).rep_;
    a = pRVar2->elements;
    if (pRVar2 == (Rep *)0x0) {
      a = (double *)0x0;
    }
    google::protobuf::internal::WireFormatLite::WriteDoubleArray
              (a,(this->basepredictionvalue_).current_size_,output);
    return;
  }
  return;
}

Assistant:

void TreeEnsembleParameters::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.TreeEnsembleParameters)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated .CoreML.Specification.TreeEnsembleParameters.TreeNode nodes = 1;
  for (unsigned int i = 0, n = this->nodes_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      1, this->nodes(i), output);
  }

  // uint64 numPredictionDimensions = 2;
  if (this->numpredictiondimensions() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt64(2, this->numpredictiondimensions(), output);
  }

  // repeated double basePredictionValue = 3;
  if (this->basepredictionvalue_size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteTag(3, ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
    output->WriteVarint32(_basepredictionvalue_cached_byte_size_);
    ::google::protobuf::internal::WireFormatLite::WriteDoubleArray(
      this->basepredictionvalue().data(), this->basepredictionvalue_size(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.TreeEnsembleParameters)
}